

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_make_symlink(char *file,wchar_t line,char *newpath,char *linkto)

{
  int iVar1;
  char *in_RCX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  iVar1 = symlink(in_RCX,in_RDX);
  if (iVar1 != 0) {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"Could not create symlink");
    logprintf("   New link: %s\n",in_RDX);
    logprintf("   Old name: %s\n",in_RCX);
    failure_finish((void *)0x107cc9);
  }
  local_4 = (wchar_t)(iVar1 == 0);
  return local_4;
}

Assistant:

int
assertion_make_symlink(const char *file, int line,
    const char *newpath, const char *linkto)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	int targetIsDir = 0;  /* TODO: Fix this */
	assertion_count(file, line);
	if (my_CreateSymbolicLinkA(newpath, linkto, targetIsDir))
		return (1);
#elif HAVE_SYMLINK
	assertion_count(file, line);
	if (0 == symlink(linkto, newpath))
		return (1);
#endif
	failure_start(file, line, "Could not create symlink");
	logprintf("   New link: %s\n", newpath);
	logprintf("   Old name: %s\n", linkto);
	failure_finish(NULL);
	return(0);
}